

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

void http_sse_unsubscribe(http_sse_s *sse_,uintptr_t subscription)

{
  char cVar1;
  undefined1 uVar2;
  subscription_s *s;
  undefined8 *puVar3;
  fio_lock_i ret;
  timespec local_38;
  
  if (subscription != 0 && sse_ != (http_sse_s *)0x0) {
    s = *(subscription_s **)(subscription + 0x10);
    LOCK();
    cVar1 = *(char *)&sse_[2].on_ready;
    *(undefined1 *)&sse_[2].on_ready = 1;
    UNLOCK();
    local_38.tv_sec = CONCAT71(local_38.tv_sec._1_7_,cVar1);
    while (cVar1 != '\0') {
      local_38.tv_sec = 0;
      local_38.tv_nsec = 1;
      nanosleep(&local_38,(timespec *)0x0);
      LOCK();
      cVar1 = *(char *)&sse_[2].on_ready;
      *(undefined1 *)&sse_[2].on_ready = 1;
      UNLOCK();
      local_38.tv_sec = CONCAT71(local_38.tv_sec._1_7_,cVar1);
    }
    puVar3 = *(undefined8 **)(subscription + 8);
    if (puVar3 != (undefined8 *)subscription) {
      *puVar3 = *(undefined8 *)subscription;
      *(undefined8 **)(*(long *)subscription + 8) = puVar3;
      free((void *)subscription);
    }
    LOCK();
    uVar2 = *(undefined1 *)&sse_[2].on_ready;
    *(undefined1 *)&sse_[2].on_ready = 0;
    UNLOCK();
    local_38.tv_sec = CONCAT71(local_38.tv_sec._1_7_,uVar2);
    fio_unsubscribe(s);
  }
  return;
}

Assistant:

void http_sse_unsubscribe(http_sse_s *sse_, uintptr_t subscription) {
  if (!sse_ || !subscription)
    return;
  http_sse_internal_s *sse = FIO_LS_EMBD_OBJ(http_sse_internal_s, sse, sse_);
  subscription_s *sub = (subscription_s *)((fio_ls_s *)subscription)->obj;
  fio_lock(&sse->lock);
  fio_ls_remove((fio_ls_s *)subscription);
  fio_unlock(&sse->lock);
  fio_unsubscribe(sub);
}